

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

void __thiscall options::load_args(options *this,int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  mapped_type *this_00;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  _Self local_230;
  allocator<char> local_221;
  key_type local_220;
  _Self local_200;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  _Self local_1a8;
  allocator<char> local_199;
  key_type local_198;
  _Self local_178;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  _Self local_120;
  allocator<char> local_111;
  key_type local_110;
  _Self local_f0;
  allocator<char> local_e1;
  undefined1 local_e0 [8];
  string paramVal;
  undefined1 local_b8 [8];
  string paramKey;
  undefined1 local_90 [8];
  string val;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string key;
  anon_class_8_1_8991fb9c aStack_30;
  int j;
  anon_class_8_1_8991fb9c set;
  anon_class_1_0_00000001 matches;
  char **argv_local;
  int argc_local;
  options *this_local;
  
  set.this._7_1_ = 0;
  aStack_30.this = this;
  for (key.field_2._12_4_ = 1; (int)key.field_2._12_4_ < argc + -1;
      key.field_2._12_4_ = key.field_2._12_4_ + 2) {
    pcVar1 = argv[(int)key.field_2._12_4_];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar1,&local_59);
    std::allocator<char>::~allocator(&local_59);
    pcVar1 = argv[(long)(int)key.field_2._12_4_ + 1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,pcVar1,(allocator<char> *)(paramKey.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(paramKey.field_2._M_local_buf + 0xf));
    bVar2 = load_args::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&set.this + 7),(string *)local_58,
                       "-threads");
    if (bVar2) {
      load_args::anon_class_8_1_8991fb9c::operator()
                (&stack0xffffffffffffffd0,(string *)local_58,(string *)local_90);
    }
    else {
      bVar2 = load_args::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&set.this + 7),(string *)local_58,"-book"
                        );
      if (bVar2) {
        load_args::anon_class_8_1_8991fb9c::operator()
                  (&stack0xffffffffffffffd0,(string *)local_58,(string *)local_90);
      }
      else {
        bVar2 = load_args::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&set.this + 7),(string *)local_58,
                           "-hashsize");
        if (bVar2) {
          load_args::anon_class_8_1_8991fb9c::operator()
                    (&stack0xffffffffffffffd0,(string *)local_58,(string *)local_90);
        }
        else {
          bVar2 = load_args::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)((long)&set.this + 7),(string *)local_58,
                             "-tune");
          if (bVar2) {
            load_args::anon_class_8_1_8991fb9c::operator()
                      (&stack0xffffffffffffffd0,(string *)local_58,(string *)local_90);
          }
          else {
            bVar2 = load_args::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)((long)&set.this + 7),(string *)local_58,
                               "-bench");
            if (bVar2) {
              load_args::anon_class_8_1_8991fb9c::operator()
                        (&stack0xffffffffffffffd0,(string *)local_58,(string *)local_90);
            }
            else {
              bVar2 = load_args::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)((long)&set.this + 7),(string *)local_58
                                 ,"-param");
              if (bVar2) {
                pcVar1 = argv[(long)(int)key.field_2._12_4_ + 1];
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_b8,pcVar1,
                           (allocator<char> *)(paramVal.field_2._M_local_buf + 0xf));
                std::allocator<char>::~allocator
                          ((allocator<char> *)(paramVal.field_2._M_local_buf + 0xf));
                pcVar1 = argv[(long)(int)key.field_2._12_4_ + 2];
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_e0,pcVar1,&local_e1);
                std::allocator<char>::~allocator(&local_e1);
                poVar3 = std::operator<<((ostream *)&std::cout,
                                         " .. setting new parameter argument: ");
                poVar3 = std::operator<<(poVar3,(string *)local_b8);
                poVar3 = std::operator<<(poVar3,"=");
                poVar3 = std::operator<<(poVar3,(string *)local_e0);
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                this_00 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&this->opts,(key_type *)local_b8);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_e0);
                set_engine_params(this);
                std::__cxx11::string::~string((string *)local_e0);
                std::__cxx11::string::~string((string *)local_b8);
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_58);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"threads",&local_111);
  local_f0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->opts,&local_110);
  local_120._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->opts);
  bVar2 = std::operator==(&local_f0,&local_120);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"-threads",&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"1",&local_169);
    load_args::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffd0,&local_140,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"multipv",&local_199);
  local_178._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->opts,&local_198);
  local_1a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->opts);
  bVar2 = std::operator==(&local_178,&local_1a8);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"-multipv",&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"1",&local_1f1);
    load_args::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffd0,&local_1c8,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"hashsize",&local_221);
  local_200._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->opts,&local_220);
  local_230._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->opts);
  bVar2 = std::operator==(&local_200,&local_230);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"-hashsize",&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"1000",&local_279);
    load_args::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffd0,&local_250,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
  }
  return;
}

Assistant:

inline void options::load_args(int argc, char* argv[]) {

	//read_param_file(std::string("engine.conf"));

	auto matches = [](std::string& s1, const char* s2) { return strcmp(s1.c_str(), s2) == 0; };
	auto set = [this](const std::string& k, const std::string& v) { this->opts.emplace(k.substr(1), v); };

	for (int j = 1; j < argc - 1; j += 2) {
		std::string key = argv[j]; std::string val = argv[j + 1];
		if (matches(key, "-threads")) set(key, val);
		else if (matches(key, "-book")) set(key, val);
		else if (matches(key, "-hashsize")) set(key, val);
		else if (matches(key, "-tune")) set(key, val);
		else if (matches(key, "-bench")) set(key, val);
		else if (matches(key, "-param"))
		{
			std::string paramKey = argv[j + 1];
			std::string paramVal = argv[j + 2]; 
			std::cout << " .. setting new parameter argument: " << paramKey << "=" << paramVal << std::endl;
			this->opts[paramKey] = paramVal;
			set_engine_params();
		}
	}

	// load defaults
	if (opts.find("threads") == opts.end())
		set(std::string("-threads"), std::string("1"));

	if (opts.find("multipv") == opts.end())
		set(std::string("-multipv"), std::string("1"));

	if (opts.find("hashsize") == opts.end())
		set(std::string("-hashsize"), std::string("1000"));
}